

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<int>::relocate(QArrayDataPointer<int> *this,qsizetype offset,int **data)

{
  int *d_first;
  int *piVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<int,long_long>(this->ptr,this->size,d_first);
  if (data != (int **)0x0) {
    piVar1 = *data;
    if ((this->ptr <= piVar1) && (piVar1 < this->ptr + this->size)) {
      *data = piVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }